

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

int Gia_ManFactorGraph(Gia_Man_t *p,Dec_Graph_t *pFForm,Vec_Int_t *vLeaves)

{
  int iVar1;
  Dec_Node_t *pDVar2;
  int local_2c;
  int Lit;
  int i;
  Dec_Node_t *pFFNode;
  Vec_Int_t *vLeaves_local;
  Dec_Graph_t *pFForm_local;
  Gia_Man_t *p_local;
  
  local_2c = 0;
  while( true ) {
    if (pFForm->nLeaves <= local_2c) {
      iVar1 = Gia_ManGraphToAig(p,pFForm);
      return iVar1;
    }
    pDVar2 = Dec_GraphNode(pFForm,local_2c);
    iVar1 = Vec_IntEntry(vLeaves,local_2c);
    if (iVar1 < 0) break;
    iVar1 = Vec_IntEntry(vLeaves,local_2c);
    (pDVar2->field_2).iFunc = iVar1;
    local_2c = local_2c + 1;
  }
  __assert_fail("Vec_IntEntry(vLeaves, i) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                ,0x6a,"int Gia_ManFactorGraph(Gia_Man_t *, Dec_Graph_t *, Vec_Int_t *)");
}

Assistant:

int Gia_ManFactorGraph( Gia_Man_t * p, Dec_Graph_t * pFForm, Vec_Int_t * vLeaves )
{
    Dec_Node_t * pFFNode;
    int i, Lit;
    // assign fanins
    Dec_GraphForEachLeaf( pFForm, pFFNode, i )
    {
        assert( Vec_IntEntry(vLeaves, i) >= 0 );
        pFFNode->iFunc = Vec_IntEntry(vLeaves, i);
    }
    // perform strashing
    Lit = Gia_ManGraphToAig( p, pFForm );
    return Lit;
}